

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSim.c
# Opt level: O3

void Res_SimPerformRound(Res_Sim_t *p,int nWords)

{
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pAVar1;
  Vec_Ptr_t *pVVar2;
  char *__assertion;
  long lVar3;
  
  if (p->vPats->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  memset(*p->vPats->pArray,0xff,(long)nWords << 2);
  pAVar1 = p->pAig;
  pVVar2 = pAVar1->vObjs;
  if (0 < pVVar2->nSize) {
    lVar3 = 0;
    do {
      pNode = (Abc_Obj_t *)pVVar2->pArray[lVar3];
      if (pNode != (Abc_Obj_t *)0x0) {
        if (((ulong)pNode & 1) != 0) {
          __assertion = "!Abc_ObjIsComplement(pNode)";
LAB_0046c71e:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                        ,0x18e,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
        }
        if (pNode->pNtk->ntkType != ABC_NTK_STRASH) {
          __assertion = "Abc_NtkIsStrash(pNode->pNtk)";
          goto LAB_0046c71e;
        }
        if ((pNode->vFanins).nSize == 2) {
          Res_SimPerformOne(pNode,p->vPats,nWords);
          pAVar1 = p->pAig;
        }
      }
      lVar3 = lVar3 + 1;
      pVVar2 = pAVar1->vObjs;
    } while (lVar3 < pVVar2->nSize);
  }
  pVVar2 = pAVar1->vPos;
  if (0 < pVVar2->nSize) {
    lVar3 = 0;
    do {
      Res_SimTransferOne((Abc_Obj_t *)pVVar2->pArray[lVar3],p->vPats,nWords);
      lVar3 = lVar3 + 1;
      pVVar2 = p->pAig->vPos;
    } while (lVar3 < pVVar2->nSize);
  }
  return;
}

Assistant:

void Res_SimPerformRound( Res_Sim_t * p, int nWords )
{
    Abc_Obj_t * pObj;
    int i;
    Abc_InfoFill( (unsigned *)Vec_PtrEntry(p->vPats,0), nWords );
    Abc_AigForEachAnd( p->pAig, pObj, i )
        Res_SimPerformOne( pObj, p->vPats, nWords );
    Abc_NtkForEachPo( p->pAig, pObj, i )
        Res_SimTransferOne( pObj, p->vPats, nWords );
}